

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BasicCopyTexImageCubeCase::createTexture(BasicCopyTexImageCubeCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  PixelFormat *pPVar8;
  char *str;
  Context *pCVar9;
  NotSupportedError *this_01;
  bool bVar10;
  deUint32 local_1f0;
  int y;
  int x;
  int face;
  int levelH;
  int levelW;
  int ndx;
  Vector<float,_3> local_1b4;
  deUint32 local_1a8;
  deUint32 shaderID;
  undefined1 local_198 [8];
  GradientShader shader;
  Random rnd;
  deUint32 tex;
  int numLevels;
  bool texHasAlpha;
  bool texHasRGB;
  TextureFormat fmt;
  bool targetHasAlpha;
  bool targetHasRGB;
  RenderTarget *renderTarget;
  BasicCopyTexImageCubeCase *this_local;
  RenderTarget *this_00;
  
  pRVar7 = Context::getRenderContext((this->super_TextureSpecCase).super_TestCase.m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  pPVar8 = tcu::RenderTarget::getPixelFormat(this_00);
  bVar1 = false;
  if (0 < pPVar8->redBits) {
    pPVar8 = tcu::RenderTarget::getPixelFormat(this_00);
    bVar1 = false;
    if (0 < pPVar8->greenBits) {
      pPVar8 = tcu::RenderTarget::getPixelFormat(this_00);
      bVar1 = 0 < pPVar8->blueBits;
    }
  }
  pPVar8 = tcu::RenderTarget::getPixelFormat(this_00);
  iVar2 = pPVar8->alphaBits;
  numLevels = (this->super_TextureSpecCase).m_texFormat.order;
  bVar10 = true;
  if ((numLevels != 8) && (bVar10 = true, numLevels != 4)) {
    bVar10 = numLevels == 1;
  }
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_1f0 = 1;
  }
  else {
    iVar3 = deLog2Floor32((this->super_TextureSpecCase).m_width);
    local_1f0 = iVar3 + 1;
  }
  rnd.m_rnd.w = local_1f0;
  rnd.m_rnd.z = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  de::Random::Random((Random *)&shader.super_ShaderProgram.m_hasGeometryShader,dVar4);
  GradientShader::GradientShader((GradientShader *)local_198);
  pCVar9 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_TextureSpecCase).super_ContextWrapper);
  local_1a8 = (*pCVar9->_vptr_Context[0x75])(pCVar9,local_198);
  if (((numLevels == 1) || (bVar1)) && ((!bVar10 || (0 < iVar2)))) {
    pCVar9 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_TextureSpecCase).super_ContextWrapper);
    dVar4 = local_1a8;
    tcu::Vector<float,_3>::Vector(&local_1b4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&levelW,1.0,1.0,0.0);
    sglr::drawQuad(pCVar9,dVar4,&local_1b4,(Vec3 *)&levelW);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_TextureSpecCase).super_ContextWrapper,1,&rnd.m_rnd.z);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,rnd.m_rnd.z);
    for (levelH = 0; levelH < (int)rnd.m_rnd.w; levelH = levelH + 1) {
      iVar2 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
      iVar3 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
      for (y = 0; y < 6; y = y + 1) {
        iVar5 = sglr::ContextWrapper::getWidth(&(this->super_TextureSpecCase).super_ContextWrapper);
        iVar5 = de::Random::getInt((Random *)&shader.super_ShaderProgram.m_hasGeometryShader,0,
                                   iVar5 - iVar2);
        iVar6 = sglr::ContextWrapper::getHeight(&(this->super_TextureSpecCase).super_ContextWrapper)
        ;
        iVar6 = de::Random::getInt((Random *)&shader.super_ShaderProgram.m_hasGeometryShader,0,
                                   iVar6 - iVar3);
        sglr::ContextWrapper::glCopyTexImage2D
                  (&(this->super_TextureSpecCase).super_ContextWrapper,
                   *(deUint32 *)(s_cubeMapFaces + (long)y * 4),levelH,this->m_internalFormat,iVar5,
                   iVar6,iVar2,iVar3,0);
      }
    }
    GradientShader::~GradientShader((GradientShader *)local_198);
    de::Random::~Random((Random *)&shader.super_ShaderProgram.m_hasGeometryShader);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x53b);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? deLog2Floor32(m_width)+1 : 1;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int levelW = de::max(1, m_width >> ndx);
			int levelH = de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int x = rnd.getInt(0, getWidth()	- levelW);
				int y = rnd.getInt(0, getHeight()	- levelH);

				glCopyTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, x, y, levelW, levelH, 0);
			}
		}
	}